

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

bool __thiscall
clipp::parser::try_match_joined<clipp::detail::select_flags>
          (parser *this,group *joinGroup,arg_string *arg,select_flags *select,arg_string *prefix)

{
  pointer pmVar1;
  bool bVar2;
  long lVar3;
  arg_mapping *a;
  arg_mapping *this_00;
  match_t *match_00;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *__range2;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  parser parse;
  match_t match;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> local_298;
  parser *local_280;
  parser local_278;
  match_t local_190;
  scoped_dfs_traverser local_d0;
  
  local_280 = this;
  parser(&local_278,joinGroup,0);
  local_298.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (match_t *)0x0;
  local_298.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (match_t *)0x0;
  while (arg->_M_string_length != 0) {
    detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_d0,&local_278.pos_);
    detail::longest_prefix_match<clipp::detail::select_flags>(&local_190,&local_d0,arg,select);
    detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_d0);
    if (local_190.pos_.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_190.pos_.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      detail::match_t::~match_t(&local_190);
      goto LAB_0013be45;
    }
    std::__cxx11::string::erase((ulong)arg,0);
    if ((((arg->_M_string_length != 0) && (prefix->_M_string_length != 0)) &&
        (lVar3 = std::__cxx11::string::find((string *)arg,(ulong)prefix), lVar3 != 0)) &&
       (bVar2 = std::operator!=(prefix,&local_190.str_), bVar2)) {
      std::__cxx11::string::insert((ulong)arg,(string *)0x0);
    }
    add_match(&local_278,&local_190);
    std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
    emplace_back<clipp::detail::match_t>(&local_298,&local_190);
    detail::match_t::~match_t(&local_190);
  }
  if ((local_298.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_298.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (this_00 = local_278.args_.
                super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                ._M_impl.super__Vector_impl_data._M_start,
     local_278.missCand_.
     super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
     ._M_impl.super__Vector_impl_data._M_start ==
     local_278.missCand_.
     super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pmVar1 = local_298.
               super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      match_00 = local_298.
                 super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (this_00 ==
          local_278.args_.
          super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013be76;
      bVar2 = arg_mapping::any_error(this_00);
      this_00 = this_00 + 1;
    } while (!bVar2);
  }
LAB_0013be45:
  bVar2 = false;
LAB_0013be47:
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector(&local_298);
  ~parser(&local_278);
  return bVar2;
LAB_0013be76:
  for (; match_00 != pmVar1; match_00 = match_00 + 1) {
    add_match(local_280,match_00);
  }
  bVar2 = true;
  goto LAB_0013be47;
}

Assistant:

bool try_match_joined(const group& joinGroup, arg_string arg,
                          const ParamSelector& select,
                          const arg_string& prefix = "")
    {
        //temporary parser with 'joinGroup' as top-level group
        parser parse {joinGroup};
        //records temporary matches
        std::vector<match_t> matches;

        while(!arg.empty()) {
            auto match = detail::longest_prefix_match(parse.pos_, arg, select);

            if(!match) return false;

            arg.erase(0, match.str().size());
            //make sure prefix is always present after the first match
            //so that, e.g., flags "-a" and "-b" will be found in "-ab"
            if(!arg.empty() && !prefix.empty() && arg.find(prefix) != 0 &&
                prefix != match.str())
            {
                arg.insert(0,prefix);
            }

            parse.add_match(match);
            matches.push_back(std::move(match));
        }

        if(!arg.empty() || matches.empty()) return false;

        if(!parse.missCand_.empty()) return false;
        for(const auto& a : parse.args_) if(a.any_error()) return false;

        //replay matches onto *this
        for(const auto& m : matches) add_match(m);
        return true;
    }